

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_stdlib.cpp
# Opt level: O0

int InputTextCallback(ImGuiInputTextCallbackData *data)

{
  ulong *puVar1;
  int iVar2;
  undefined8 uVar3;
  int *in_RDI;
  string *str;
  InputTextCallback_UserData *user_data;
  
  puVar1 = *(ulong **)(in_RDI + 2);
  if (*in_RDI == 0x40000) {
    std::__cxx11::string::resize(*puVar1);
    uVar3 = std::__cxx11::string::c_str();
    *(undefined8 *)(in_RDI + 6) = uVar3;
  }
  else if (puVar1[1] != 0) {
    *(ulong *)(in_RDI + 2) = puVar1[2];
    iVar2 = (*(code *)puVar1[1])(in_RDI);
    return iVar2;
  }
  return 0;
}

Assistant:

static int InputTextCallback(ImGuiInputTextCallbackData* data)
{
    InputTextCallback_UserData* user_data = (InputTextCallback_UserData*)data->UserData;
    if (data->EventFlag == ImGuiInputTextFlags_CallbackResize)
    {
        // Resize string callback
        // If for some reason we refuse the new length (BufTextLen) and/or capacity (BufSize) we need to set them back to what we want.
        std::string* str = user_data->Str;
        IM_ASSERT(data->Buf == str->c_str());
        str->resize(data->BufTextLen);
        data->Buf = (char*)str->c_str();
    }
    else if (user_data->ChainCallback)
    {
        // Forward to user callback, if any
        data->UserData = user_data->ChainCallbackUserData;
        return user_data->ChainCallback(data);
    }
    return 0;
}